

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::~Segment(Segment *this)

{
  Cluster *this_00;
  Frame *this_01;
  Frame *frame;
  int32_t i_1;
  Cluster *cluster;
  int32_t i;
  Segment *this_local;
  
  if (this->cluster_list_ != (Cluster **)0x0) {
    for (cluster._4_4_ = 0; cluster._4_4_ < this->cluster_list_size_;
        cluster._4_4_ = cluster._4_4_ + 1) {
      this_00 = this->cluster_list_[cluster._4_4_];
      if (this_00 != (Cluster *)0x0) {
        Cluster::~Cluster(this_00);
        operator_delete(this_00);
      }
    }
    if (this->cluster_list_ != (Cluster **)0x0) {
      operator_delete__(this->cluster_list_);
    }
  }
  if (this->frames_ != (Frame **)0x0) {
    for (frame._4_4_ = 0; frame._4_4_ < this->frames_size_; frame._4_4_ = frame._4_4_ + 1) {
      this_01 = this->frames_[frame._4_4_];
      if (this_01 != (Frame *)0x0) {
        Frame::~Frame(this_01);
        operator_delete(this_01);
      }
    }
    if (this->frames_ != (Frame **)0x0) {
      operator_delete__(this->frames_);
    }
  }
  if (this->chunk_name_ != (char *)0x0) {
    operator_delete__(this->chunk_name_);
  }
  if (this->chunking_base_name_ != (char *)0x0) {
    operator_delete__(this->chunking_base_name_);
  }
  if (this->chunk_writer_cluster_ != (MkvWriter *)0x0) {
    MkvWriter::Close(this->chunk_writer_cluster_);
    if (this->chunk_writer_cluster_ != (MkvWriter *)0x0) {
      (*(this->chunk_writer_cluster_->super_IMkvWriter)._vptr_IMkvWriter[6])();
    }
  }
  if (this->chunk_writer_cues_ != (MkvWriter *)0x0) {
    MkvWriter::Close(this->chunk_writer_cues_);
    if (this->chunk_writer_cues_ != (MkvWriter *)0x0) {
      (*(this->chunk_writer_cues_->super_IMkvWriter)._vptr_IMkvWriter[6])();
    }
  }
  if (this->chunk_writer_header_ != (MkvWriter *)0x0) {
    MkvWriter::Close(this->chunk_writer_header_);
    if (this->chunk_writer_header_ != (MkvWriter *)0x0) {
      (*(this->chunk_writer_header_->super_IMkvWriter)._vptr_IMkvWriter[6])();
    }
  }
  Tags::~Tags(&this->tags_);
  Chapters::~Chapters(&this->chapters_);
  Tracks::~Tracks(&this->tracks_);
  SegmentInfo::~SegmentInfo(&this->segment_info_);
  SeekHead::~SeekHead(&this->seek_head_);
  Cues::~Cues(&this->cues_);
  return;
}

Assistant:

Segment::~Segment() {
  if (cluster_list_) {
    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      Cluster* const cluster = cluster_list_[i];
      delete cluster;
    }
    delete[] cluster_list_;
  }

  if (frames_) {
    for (int32_t i = 0; i < frames_size_; ++i) {
      Frame* const frame = frames_[i];
      delete frame;
    }
    delete[] frames_;
  }

  delete[] chunk_name_;
  delete[] chunking_base_name_;

  if (chunk_writer_cluster_) {
    chunk_writer_cluster_->Close();
    delete chunk_writer_cluster_;
  }
  if (chunk_writer_cues_) {
    chunk_writer_cues_->Close();
    delete chunk_writer_cues_;
  }
  if (chunk_writer_header_) {
    chunk_writer_header_->Close();
    delete chunk_writer_header_;
  }
}